

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall
soul::heart::AssignFromValue::AssignFromValue
          (AssignFromValue *this,CodeLocation *l,Expression *dest,Expression *src)

{
  CodeLocation local_28;
  pool_ptr<soul::heart::Expression> local_18;
  
  local_28.sourceCode.object = (l->sourceCode).object;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  local_28.location.data = (l->location).data;
  local_18.object = dest;
  Assignment::Assignment(&this->super_Assignment,&local_28,&local_18);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.sourceCode.object);
  (this->super_Assignment).super_Statement.super_Object._vptr_Object =
       (_func_int **)&PTR__AssignFromValue_002da338;
  (this->source).object = src;
  return;
}

Assistant:

AssignFromValue (CodeLocation l, Expression& dest, Expression& src)
            : Assignment (std::move (l), dest), source (src) {}